

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::TransformFeedback::ErrorsTest::prepareFunctionPointers(ErrorsTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  undefined4 *puVar3;
  MessageBuilder local_198;
  long local_18;
  Functions *gl;
  ErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar1);
  this->m_gl_getTransformFeedbackiv = *(GetTransformFeedbackiv_ProcAddress *)(local_18 + 0xb30);
  this->m_gl_getTransformFeedbacki_v = *(GetTransformFeedbacki_v_ProcAddress *)(local_18 + 0xb28);
  this->m_gl_getTransformFeedbacki64_v =
       *(GetTransformFeedbacki64_v_ProcAddress *)(local_18 + 0xb20);
  if (((this->m_gl_getTransformFeedbackiv != (GetTransformFeedbackiv_ProcAddress)0x0) &&
      (this->m_gl_getTransformFeedbacki_v != (GetTransformFeedbacki_v_ProcAddress)0x0)) &&
     (this->m_gl_getTransformFeedbacki64_v != (GetTransformFeedbacki64_v_ProcAddress)0x0)) {
    return;
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_198,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  this_02 = tcu::MessageBuilder::operator<<
                      (&local_198,(char (*) [42])"Function pointers are set to NULL values.");
  tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&int::typeinfo,0);
}

Assistant:

void ErrorsTest::prepareFunctionPointers()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching function pointers. */
	m_gl_getTransformFeedbackiv	= (GetTransformFeedbackiv_ProcAddress)gl.getTransformFeedbackiv;
	m_gl_getTransformFeedbacki_v   = (GetTransformFeedbacki_v_ProcAddress)gl.getTransformFeedbacki_v;
	m_gl_getTransformFeedbacki64_v = (GetTransformFeedbacki64_v_ProcAddress)gl.getTransformFeedbacki64_v;

	if ((DE_NULL == m_gl_getTransformFeedbackiv) || (DE_NULL == m_gl_getTransformFeedbacki_v) ||
		(DE_NULL == m_gl_getTransformFeedbacki64_v))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Function pointers are set to NULL values."
											<< tcu::TestLog::EndMessage;

		throw 0;
	}
}